

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigStrSim.c
# Opt level: O3

void Saig_StrSimTableInsert(Aig_Obj_t **ppTable,Aig_Obj_t **ppNexts,int nTableSize,Aig_Obj_t *pObj)

{
  int *piVar1;
  undefined1 auVar2 [16];
  Aig_Obj_t **ppAVar3;
  long lVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  
  uVar5 = 0;
  uVar6 = 0;
  uVar7 = 0;
  uVar8 = 0;
  lVar4 = 0;
  do {
    piVar1 = (int *)((long)(pObj->field_5).pData + lVar4);
    auVar2 = *(undefined1 (*) [16])((long)Saig_StrSimHash::s_SPrimes + lVar4);
    uVar5 = uVar5 ^ auVar2._0_4_ * *piVar1;
    uVar6 = uVar6 ^ auVar2._4_4_ * piVar1[1];
    uVar7 = uVar7 ^ (uint)((auVar2._8_8_ & 0xffffffff) * (ulong)(uint)piVar1[2]);
    uVar8 = uVar8 ^ auVar2._12_4_ * piVar1[3];
    lVar4 = lVar4 + 0x10;
  } while (lVar4 != 0x40);
  ppAVar3 = ppTable + (int)((uVar8 ^ uVar6 ^ uVar7 ^ uVar5) % (uint)nTableSize);
  if (*ppAVar3 != (Aig_Obj_t *)0x0) {
    ppNexts[pObj->Id] = ppNexts[(*ppAVar3)->Id];
    ppAVar3 = ppNexts + (*ppAVar3)->Id;
  }
  *ppAVar3 = pObj;
  return;
}

Assistant:

void Saig_StrSimTableInsert( Aig_Obj_t ** ppTable, Aig_Obj_t ** ppNexts, int nTableSize, Aig_Obj_t * pObj )
{
    // find the hash entry
    int iEntry = Saig_StrSimHash( pObj ) % nTableSize;
    // check if there are nodes with this signatures
    if ( ppTable[iEntry] == NULL )
        ppTable[iEntry] = pObj;
    else
    {
        Saig_ObjSetNext( ppNexts, pObj, Saig_ObjNext(ppNexts, ppTable[iEntry]) );
        Saig_ObjSetNext( ppNexts, ppTable[iEntry], pObj );
    }
}